

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O0

string * __thiscall
vkt::tessellation::anon_unknown_1::IOBlock::glslTraverseBasicTypeArray
          (string *__return_storage_ptr__,IOBlock *this,int numArrayElements,int indentationDepth,
          BasicTypeVisitFunc visit)

{
  int iVar1;
  ostream *poVar2;
  size_type sVar3;
  const_reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  string local_400;
  int local_3dc;
  ostringstream local_3d8 [4];
  int i_1;
  ostringstream result_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200;
  int local_1dc;
  ostringstream local_1d8 [4];
  int i;
  ostringstream result;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string indentation;
  BasicTypeVisitFunc visit_local;
  int indentationDepth_local;
  int numArrayElements_local;
  IOBlock *this_local;
  
  indentation.field_2._8_8_ = visit;
  if (numArrayElements < 0) {
    std::__cxx11::ostringstream::ostringstream(local_3d8);
    local_3dc = 0;
    while( true ) {
      iVar1 = local_3dc;
      sVar3 = std::
              vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
              ::size(&this->m_members);
      if ((int)sVar3 <= iVar1) break;
      std::operator+(&local_440,&this->m_interfaceName,"[gl_InvocationID].");
      pvVar4 = std::
               vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
               ::operator[](&this->m_members,(long)local_3dc);
      std::operator+(&local_420,&local_440,&pvVar4->name);
      pvVar4 = std::
               vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
               ::operator[](&this->m_members,(long)local_3dc);
      glslTraverseBasicTypes
                (&local_400,&local_420,&pvVar4->type,0,indentationDepth,
                 (BasicTypeVisitFunc)indentation.field_2._8_8_);
      std::operator<<((ostream *)local_3d8,(string *)&local_400);
      std::__cxx11::string::~string((string *)&local_400);
      std::__cxx11::string::~string((string *)&local_420);
      std::__cxx11::string::~string((string *)&local_440);
      local_3dc = local_3dc + 1;
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_3d8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_48,(long)indentationDepth,'\t',&local_49);
    std::allocator<char>::~allocator(&local_49);
    std::__cxx11::ostringstream::ostringstream(local_1d8);
    poVar2 = std::operator<<((ostream *)local_1d8,(string *)local_48);
    poVar2 = std::operator<<(poVar2,"for (int i0 = 0; i0 < ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,numArrayElements);
    poVar2 = std::operator<<(poVar2,"; ++i0)\n");
    poVar2 = std::operator<<(poVar2,(string *)local_48);
    std::operator<<(poVar2,"{\n");
    local_1dc = 0;
    while( true ) {
      iVar1 = local_1dc;
      sVar3 = std::
              vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
              ::size(&this->m_members);
      if ((int)sVar3 <= iVar1) break;
      std::operator+(&local_240,&this->m_interfaceName,"[i0].");
      pvVar4 = std::
               vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
               ::operator[](&this->m_members,(long)local_1dc);
      std::operator+(&local_220,&local_240,&pvVar4->name);
      pvVar4 = std::
               vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
               ::operator[](&this->m_members,(long)local_1dc);
      glslTraverseBasicTypes
                (&local_200,&local_220,&pvVar4->type,1,indentationDepth + 1,
                 (BasicTypeVisitFunc)indentation.field_2._8_8_);
      std::operator<<((ostream *)local_1d8,(string *)&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
      local_1dc = local_1dc + 1;
    }
    std::operator+(&local_260,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   "}\n");
    std::operator<<((ostream *)local_1d8,(string *)&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_1d8);
    std::__cxx11::string::~string((string *)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string IOBlock::glslTraverseBasicTypeArray (const int numArrayElements, const int indentationDepth, BasicTypeVisitFunc visit) const
{
	if (numArrayElements >= 0)
	{
		const std::string	indentation = std::string(indentationDepth, '\t');
		std::ostringstream	result;

		result << indentation << "for (int i0 = 0; i0 < " << numArrayElements << "; ++i0)\n"
			   << indentation << "{\n";
		for (int i = 0; i < static_cast<int>(m_members.size()); ++i)
			result << glslTraverseBasicTypes(m_interfaceName + "[i0]." + m_members[i].name, m_members[i].type, 1, indentationDepth + 1, visit);
		result << indentation + "}\n";
		return result.str();
	}
	else
	{
		std::ostringstream result;
		for (int i = 0; i < static_cast<int>(m_members.size()); ++i)
			result << glslTraverseBasicTypes(m_interfaceName + "[gl_InvocationID]." + m_members[i].name, m_members[i].type, 0, indentationDepth, visit);
		return result.str();
	}
}